

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O3

BBox3fa * embree::sse2::evalGridBounds
                    (BBox3fa *__return_storage_ptr__,SubdivPatch1Base *patch,uint x0,uint x1,uint y0
                    ,uint y1,uint swidth,uint sheight,SubdivMesh *geom)

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar3;
  undefined8 *puVar4;
  size_t sVar5;
  ulong uVar6;
  float *pfVar7;
  pointer pRVar8;
  BufferView<embree::Vec3fa> *pBVar9;
  char *pcVar10;
  long lVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined8 uVar24;
  undefined8 uVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  size_t i;
  ulong uVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  long lVar34;
  void *pvVar35;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *Nx;
  ulong uVar36;
  uint uVar37;
  uint dwidth;
  int iVar38;
  uint uVar39;
  float fVar40;
  float *pfVar42;
  float fVar43;
  uint uVar44;
  undefined4 *puVar45;
  long lVar46;
  long lVar47;
  float *pfVar48;
  ulong uVar49;
  float *pfVar50;
  ulong uVar51;
  uint uVar52;
  int iVar53;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar54;
  float fVar55;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar94;
  float fVar95;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  undefined1 in_XMM6 [16];
  float fVar105;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  uint x;
  GeneralCatmullClarkPatch3fa ccpatch;
  StackArray<float,_16384UL> grid_x;
  StackArray<float,_16384UL> grid_y;
  Vec3vfx normal;
  StackArray<float,_16384UL> grid_u;
  StackArray<float,_16384UL> grid_v;
  StackArray<float,_16384UL> grid_Ng_y;
  StackArray<float,_16384UL> grid_Ng_x;
  undefined1 auStack_22040 [16];
  float fStack_22024;
  undefined1 auStack_21ff0 [16];
  undefined1 *puStack_21f50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_21f00;
  uint uStack_21ef0;
  uint uStack_21eec;
  float *pfStack_21ee8;
  float *pfStack_21ee0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paStack_21ed8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paStack_21ed0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paStack_21ec8;
  float *pfStack_21ec0;
  float *pfStack_21eb8;
  float *pfStack_21eb0;
  uint uStack_21ea8;
  undefined4 auStack_21b9c [1575];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paStack_20300;
  undefined4 uStack_202c0;
  undefined8 uStack_20280;
  undefined8 uStack_20278;
  float fStack_20270;
  float fStack_2026c;
  undefined8 uStack_20268;
  undefined8 uStack_20260;
  undefined8 uStack_20258;
  undefined1 *puStack_20250;
  undefined1 (*pauStack_20248) [16];
  undefined1 *puStack_20240;
  undefined1 *puStack_20238;
  undefined1 (*pauStack_20230) [16];
  undefined4 uStack_20228;
  float *pfStack_1c280;
  ulong uStack_1c278;
  undefined1 auStack_1c240 [16];
  undefined1 auStack_1c230 [16];
  undefined1 aauStack_1c220 [1022] [16];
  float *pfStack_18240;
  ulong uStack_18238;
  undefined1 auStack_18200 [16];
  undefined1 auStack_181f0 [16];
  undefined1 aauStack_181e0 [1022] [16];
  float *pfStack_14200;
  ulong uStack_141f8;
  float afStack_141c0 [4096];
  float *pfStack_101c0;
  ulong uStack_101b8;
  float afStack_10180 [4096];
  float *local_c180;
  ulong local_c178;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_c140 [1024];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *local_8140;
  ulong local_8138;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_8100 [1024];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *local_4100;
  ulong local_40f8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_40c0 [1024];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *local_c0;
  ulong local_b8;
  ulong uVar41;
  
  auStack_21ff0._8_8_ = 0x7f8000007f800000;
  auStack_21ff0._0_8_ = 0x7f8000007f800000;
  *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0x7f8000007f800000;
  auVar63 = _DAT_01f7aa00;
  *(undefined1 (*) [16])(__return_storage_ptr__->upper).field_0.m128 = _DAT_01f7aa00;
  uVar37 = x1 - x0;
  dwidth = uVar37 + 1;
  iVar53 = y1 - y0;
  uVar52 = iVar53 + 1;
  uVar39 = uVar52 * dwidth;
  uVar36 = (ulong)uVar39;
  uVar27 = uVar39 + 3;
  uVar28 = uVar27 >> 2;
  uVar49 = (ulong)(uVar39 + 4);
  uStack_101b8 = uVar49;
  local_c178 = uVar49;
  if (uVar39 + 4 < 0x1001) {
    pfStack_101c0 = afStack_141c0;
    local_c180 = afStack_10180;
    if (patch->type != '\x05') {
LAB_00d5be81:
      uVar44 = swidth - 1;
      uVar1 = sheight - 1;
      if (uVar52 != 0) {
        auVar80._0_4_ = (float)(int)uVar44;
        auVar80._4_4_ = (float)(int)uVar44;
        auVar80._8_4_ = (float)(int)uVar44;
        auVar80._12_4_ = (float)(int)uVar44;
        auVar84 = rcpps(in_XMM5,auVar80);
        fVar89 = auVar84._0_4_;
        fVar94 = auVar84._4_4_;
        fVar55 = auVar84._8_4_;
        fVar95 = auVar84._12_4_;
        auVar84._0_4_ = (float)(int)uVar1;
        auVar84._4_4_ = (float)(int)uVar1;
        auVar84._8_4_ = (float)(int)uVar1;
        auVar84._12_4_ = (float)(int)uVar1;
        auVar88 = rcpps(in_XMM6,auVar84);
        fVar43 = auVar88._0_4_;
        fVar40 = auVar88._4_4_;
        fVar104 = auVar88._8_4_;
        fVar105 = auVar88._12_4_;
        iVar106 = 0;
        iVar107 = 0;
        iVar108 = 0;
        iVar109 = 0;
        lVar46 = 0;
        iVar38 = 0;
        do {
          if (dwidth != 0) {
            uVar49 = 0;
            iVar110 = 0;
            iVar111 = 1;
            iVar112 = 2;
            iVar113 = 3;
            do {
              uVar52 = (int)lVar46 + (int)uVar49;
              pfVar42 = pfStack_101c0 + uVar52;
              *pfVar42 = (float)(~-(uint)(iVar110 < (int)uVar44) & 0x3f800000 |
                                (uint)((float)(int)(iVar110 + x0) *
                                      ((1.0 - auVar80._0_4_ * fVar89) * fVar89 + fVar89)) &
                                -(uint)(iVar110 < (int)uVar44));
              pfVar42[1] = (float)(~-(uint)(iVar111 < (int)uVar44) & 0x3f800000 |
                                  (uint)((float)(int)(iVar111 + x0) *
                                        ((1.0 - auVar80._4_4_ * fVar94) * fVar94 + fVar94)) &
                                  -(uint)(iVar111 < (int)uVar44));
              pfVar42[2] = (float)(~-(uint)(iVar112 < (int)uVar44) & 0x3f800000 |
                                  (uint)((float)(int)(iVar112 + x0) *
                                        ((1.0 - auVar80._8_4_ * fVar55) * fVar55 + fVar55)) &
                                  -(uint)(iVar112 < (int)uVar44));
              pfVar42[3] = (float)(~-(uint)(iVar113 < (int)uVar44) & 0x3f800000 |
                                  (uint)((float)(int)(iVar113 + x0) *
                                        ((1.0 - auVar80._12_4_ * fVar95) * fVar95 + fVar95)) &
                                  -(uint)(iVar113 < (int)uVar44));
              pfVar42 = local_c180 + uVar52;
              *pfVar42 = (float)(~-(uint)(iVar106 < (int)uVar1) & 0x3f800000 |
                                (uint)((float)(int)(iVar106 + y0) *
                                      ((1.0 - auVar84._0_4_ * fVar43) * fVar43 + fVar43)) &
                                -(uint)(iVar106 < (int)uVar1));
              pfVar42[1] = (float)(~-(uint)(iVar107 < (int)uVar1) & 0x3f800000 |
                                  (uint)((float)(int)(iVar107 + y0) *
                                        ((1.0 - auVar84._4_4_ * fVar40) * fVar40 + fVar40)) &
                                  -(uint)(iVar107 < (int)uVar1));
              pfVar42[2] = (float)(~-(uint)(iVar108 < (int)uVar1) & 0x3f800000 |
                                  (uint)((float)(int)(iVar108 + y0) *
                                        ((1.0 - auVar84._8_4_ * fVar104) * fVar104 + fVar104)) &
                                  -(uint)(iVar108 < (int)uVar1));
              pfVar42[3] = (float)(~-(uint)(iVar109 < (int)uVar1) & 0x3f800000 |
                                  (uint)((float)(int)(iVar109 + y0) *
                                        ((1.0 - auVar84._12_4_ * fVar105) * fVar105 + fVar105)) &
                                  -(uint)(iVar109 < (int)uVar1));
              uVar49 = uVar49 + 4;
              iVar110 = iVar110 + 4;
              iVar111 = iVar111 + 4;
              iVar112 = iVar112 + 4;
              iVar113 = iVar113 + 4;
            } while (uVar49 < dwidth);
          }
          iVar106 = iVar106 + 1;
          iVar107 = iVar107 + 1;
          iVar108 = iVar108 + 1;
          iVar109 = iVar109 + 1;
          lVar46 = lVar46 + (ulong)dwidth;
          bVar57 = iVar38 != iVar53;
          iVar38 = iVar38 + 1;
        } while (bVar57);
      }
      if (uVar39 < (uVar27 & 0xfffffffc)) {
        fVar89 = pfStack_101c0[uVar39 - 1];
        fVar94 = local_c180[uVar39 - 1];
        do {
          pfStack_101c0[uVar36] = fVar89;
          local_c180[uVar36] = fVar94;
          uVar36 = uVar36 + 1;
        } while ((uVar27 & 0xfffffffc) != uVar36);
      }
      if ((patch->flags & 0x10) != 0) {
        fVar89 = patch->level[1];
        uVar52 = x1 + 1;
        fVar94 = patch->level[2];
        iVar38 = (int)(long)patch->level[0];
        iVar106 = (int)(long)fVar94;
        fVar55 = patch->level[3];
        if (iVar38 + 1U < swidth && y0 == 0) {
          if (x0 <= x1) {
            fVar95 = (float)((long)patch->level[0] & 0xffffffff);
            auVar80 = rcpss(ZEXT416((uint)fVar95),ZEXT416((uint)fVar95));
            fVar95 = (2.0 - fVar95 * auVar80._0_4_) * auVar80._0_4_;
            iVar107 = swidth * 2 + -2;
            uVar39 = x0 + 1;
            if (x0 + 1 < uVar52) {
              uVar39 = uVar52;
            }
            uVar29 = (uVar39 - x0) - 1;
            iVar108 = (x0 * 2 + 1) * iVar38;
            iVar109 = (x0 * 2 + 3) * iVar38;
            lVar46 = 0;
            do {
              if ((bool)(~((int)(uVar29 ^ 0x80000000) < (int)((uint)lVar46 ^ 0x80000000)) & 1)) {
                pfStack_101c0[lVar46] = (float)(iVar108 / iVar107) * fVar95;
              }
              if ((int)(((uint)lVar46 | 1) ^ 0x80000000) <= (int)(uVar29 ^ 0x80000000)) {
                pfStack_101c0[lVar46 + 1] = (float)(iVar109 / iVar107) * fVar95;
              }
              lVar46 = lVar46 + 2;
              iVar108 = iVar108 + iVar38 * 4;
              iVar109 = iVar109 + iVar38 * 4;
            } while (((uVar39 - x0) + 1 & 0xfffffffe) != (uint)lVar46);
          }
          if (uVar44 == x1) {
            pfStack_101c0[uVar37] = 1.0;
          }
        }
        iVar38 = (int)(long)fVar89;
        if (iVar106 + 1U < swidth && y1 + 1 == sheight) {
          uVar49 = (ulong)(iVar53 * dwidth);
          if (x0 <= x1) {
            fVar94 = (float)((long)fVar94 & 0xffffffff);
            auVar80 = rcpss(ZEXT416((uint)fVar94),ZEXT416((uint)fVar94));
            fVar94 = (2.0 - fVar94 * auVar80._0_4_) * auVar80._0_4_;
            iVar107 = swidth * 2 + -2;
            uVar39 = x0 + 1;
            if (x0 + 1 < uVar52) {
              uVar39 = uVar52;
            }
            uVar29 = (uVar39 - x0) - 1;
            iVar109 = (x0 * 2 + 1) * iVar106;
            iVar108 = (x0 * 2 + 3) * iVar106;
            lVar46 = 0;
            do {
              if ((bool)(~((int)(uVar29 ^ 0x80000000) < (int)((uint)lVar46 ^ 0x80000000)) & 1)) {
                pfStack_101c0[uVar49 + lVar46] = (float)(iVar109 / iVar107) * fVar94;
              }
              if ((int)(((uint)lVar46 | 1) ^ 0x80000000) <= (int)(uVar29 ^ 0x80000000)) {
                pfStack_101c0[uVar49 + lVar46 + 1] = (float)(iVar108 / iVar107) * fVar94;
              }
              lVar46 = lVar46 + 2;
              iVar109 = iVar109 + iVar106 * 4;
              iVar108 = iVar108 + iVar106 * 4;
            } while (((uVar39 - x0) + 1 & 0xfffffffe) != (uint)lVar46);
          }
          if (uVar44 == x1) {
            pfStack_101c0[uVar49 + uVar37] = 1.0;
          }
        }
        iVar106 = (int)(long)fVar55;
        if (iVar38 + 1U < sheight && x0 == 0) {
          if (y0 <= y1) {
            fVar89 = (float)((long)fVar89 & 0xffffffff);
            auVar80 = rcpss(ZEXT416((uint)fVar89),ZEXT416((uint)fVar89));
            iVar107 = (y0 * 2 + 1) * iVar38;
            uVar44 = 0;
            uVar39 = y0;
            do {
              local_c180[(ulong)uVar37 + (ulong)uVar44] =
                   (float)(iVar107 / (int)(sheight * 2 + -2)) *
                   (2.0 - fVar89 * auVar80._0_4_) * auVar80._0_4_;
              uVar39 = uVar39 + 1;
              uVar44 = uVar44 + dwidth;
              iVar107 = iVar107 + iVar38 * 2;
            } while (uVar39 <= y1);
          }
          if (uVar1 == y1) {
            local_c180[(ulong)uVar37 + (ulong)(iVar53 * dwidth)] = 1.0;
          }
        }
        if (iVar106 + 1U < sheight && uVar52 == swidth) {
          if (y0 <= y1) {
            fVar89 = (float)((long)fVar55 & 0xffffffff);
            auVar80 = rcpss(ZEXT416((uint)fVar89),ZEXT416((uint)fVar89));
            iVar38 = (y0 * 2 + 1) * iVar106;
            uVar49 = 0;
            do {
              local_c180[uVar49] =
                   (float)(iVar38 / (int)(sheight * 2 + -2)) *
                   (2.0 - fVar89 * auVar80._0_4_) * auVar80._0_4_;
              y0 = y0 + 1;
              uVar49 = (ulong)((int)uVar49 + dwidth);
              iVar38 = iVar38 + iVar106 * 2;
            } while (y0 <= y1);
          }
          if (uVar1 == y1) {
            local_c180[iVar53 * dwidth] = 1.0;
          }
        }
      }
      auStack_22040 = _DAT_01f7a9f0;
      auVar80 = auVar63;
      auVar84 = _DAT_01f7a9f0;
      auVar88 = auVar63;
      if (3 < uVar27) {
        lVar46 = 0;
        auStack_21ff0 = _DAT_01f7a9f0;
        auVar63 = _DAT_01f7aa00;
        auVar80 = _DAT_01f7aa00;
        auVar88 = _DAT_01f7aa00;
        do {
          local_8100[0]._0_8_ = *(undefined8 *)((long)pfStack_101c0 + lVar46);
          local_8100[0]._8_8_ = ((undefined8 *)((long)pfStack_101c0 + lVar46))[1];
          local_c140[0]._0_8_ = *(undefined8 *)((long)local_c180 + lVar46);
          local_c140[0]._8_8_ = ((undefined8 *)((long)local_c180 + lVar46))[1];
          patchEval<embree::vfloat_impl<4>>
                    (patch,(vfloat_impl<4> *)local_8100,(vfloat_impl<4> *)local_c140);
          if (*(long *)&(geom->super_Geometry).field_0x58 != 0) {
            patchNormal<embree::vfloat_impl<4>>
                      (patch,(vfloat_impl<4> *)local_8100,(vfloat_impl<4> *)local_c140);
            auVar93._0_4_ = fStack_20270 * fStack_20270 + (float)uStack_20260 * (float)uStack_20260;
            auVar93._4_4_ = fStack_2026c * fStack_2026c + uStack_20260._4_4_ * uStack_20260._4_4_;
            auVar93._8_4_ =
                 (float)uStack_20268 * (float)uStack_20268 +
                 (float)uStack_20258 * (float)uStack_20258;
            auVar93._12_4_ =
                 uStack_20268._4_4_ * uStack_20268._4_4_ + uStack_20258._4_4_ * uStack_20258._4_4_;
            auVar103._0_4_ = (float)uStack_20280 * (float)uStack_20280 + auVar93._0_4_;
            auVar103._4_4_ = uStack_20280._4_4_ * uStack_20280._4_4_ + auVar93._4_4_;
            auVar103._8_4_ = (float)uStack_20278 * (float)uStack_20278 + auVar93._8_4_;
            auVar103._12_4_ = uStack_20278._4_4_ * uStack_20278._4_4_ + auVar93._12_4_;
            uVar52 = -(uint)(auVar103._0_4_ != 0.0);
            uVar27 = -(uint)(auVar103._4_4_ != 0.0);
            uVar39 = -(uint)(auVar103._8_4_ != 0.0);
            uVar37 = -(uint)(auVar103._12_4_ != 0.0);
            auVar93 = rsqrtps(auVar93,auVar103);
            fVar89 = auVar93._0_4_;
            fVar94 = auVar93._4_4_;
            fVar55 = auVar93._8_4_;
            fVar95 = auVar93._12_4_;
            fVar89 = fVar89 * fVar89 * auVar103._0_4_ * -0.5 * fVar89 + fVar89 * 1.5;
            fVar94 = fVar94 * fVar94 * auVar103._4_4_ * -0.5 * fVar94 + fVar94 * 1.5;
            fVar55 = fVar55 * fVar55 * auVar103._8_4_ * -0.5 * fVar55 + fVar55 * 1.5;
            fVar95 = fVar95 * fVar95 * auVar103._12_4_ * -0.5 * fVar95 + fVar95 * 1.5;
            auVar96._0_4_ = ~uVar52 & (uint)(float)uStack_20280;
            auVar96._4_4_ = ~uVar27 & (uint)uStack_20280._4_4_;
            auVar96._8_4_ = ~uVar39 & (uint)(float)uStack_20278;
            auVar96._12_4_ = ~uVar37 & (uint)uStack_20278._4_4_;
            auVar101._0_4_ = ~uVar52 & (uint)fStack_20270;
            auVar101._4_4_ = ~uVar27 & (uint)fStack_2026c;
            auVar101._8_4_ = ~uVar39 & (uint)(float)uStack_20268;
            auVar101._12_4_ = ~uVar37 & (uint)uStack_20268._4_4_;
            auStack_18200._0_4_ = (uint)((float)uStack_20280 * fVar89) & uVar52;
            auStack_18200._4_4_ = (uint)(uStack_20280._4_4_ * fVar94) & uVar27;
            auStack_18200._8_4_ = (uint)((float)uStack_20278 * fVar55) & uVar39;
            auStack_18200._12_4_ = (uint)(uStack_20278._4_4_ * fVar95) & uVar37;
            auStack_18200 = auStack_18200 | auVar96;
            auStack_181f0._0_4_ = (uint)(fStack_20270 * fVar89) & uVar52;
            auStack_181f0._4_4_ = (uint)(fStack_2026c * fVar94) & uVar27;
            auStack_181f0._8_4_ = (uint)((float)uStack_20268 * fVar55) & uVar39;
            auStack_181f0._12_4_ = (uint)(uStack_20268._4_4_ * fVar95) & uVar37;
            auStack_181f0 = auStack_181f0 | auVar101;
            auVar100._0_4_ = (uint)(fVar89 * (float)uStack_20260) & uVar52;
            auVar100._4_4_ = (uint)(fVar94 * uStack_20260._4_4_) & uVar27;
            auVar100._8_4_ = (uint)(fVar55 * (float)uStack_20258) & uVar39;
            auVar100._12_4_ = (uint)(fVar95 * uStack_20258._4_4_) & uVar37;
            aauStack_181e0[0]._0_4_ = ~uVar52 & (uint)(float)uStack_20260;
            aauStack_181e0[0]._4_4_ = ~uVar27 & (uint)uStack_20260._4_4_;
            aauStack_181e0[0]._8_4_ = ~uVar39 & (uint)(float)uStack_20258;
            aauStack_181e0[0]._12_4_ = ~uVar37 & (uint)uStack_20258._4_4_;
            aauStack_181e0[0] = aauStack_181e0[0] | auVar100;
            uStack_20280 = (geom->super_Geometry).userPtr;
            uStack_20278 = geom;
            fStack_20270 = (float)patch->prim;
            fStack_2026c = (float)patch->time_;
            uStack_20258 = auStack_18200;
            puStack_20250 = auStack_181f0;
            pauStack_20248 = aauStack_181e0;
            puStack_20240 = auStack_1c240;
            puStack_20238 = auStack_1c230;
            pauStack_20230 = aauStack_1c220;
            uStack_20228 = 4;
            uStack_20268 = local_8100;
            uStack_20260 = local_c140;
            (**(code **)&(geom->super_Geometry).field_0x58)(&uStack_20280);
          }
          auStack_21ff0 = minps(auStack_21ff0,auStack_1c240);
          auVar80 = maxps(auVar80,auStack_1c240);
          auStack_22040 = minps(auStack_22040,auStack_1c230);
          auVar63 = maxps(auVar63,auStack_1c230);
          auVar84 = minps(auVar84,aauStack_1c220[0]);
          auVar88 = maxps(auVar88,aauStack_1c220[0]);
          lVar46 = lVar46 + 0x10;
        } while ((ulong)(uVar28 + (uVar28 == 0)) << 4 != lVar46);
      }
      auVar58._4_4_ = auStack_21ff0._0_4_;
      auVar58._0_4_ = auStack_21ff0._4_4_;
      auVar58._8_4_ = auStack_21ff0._12_4_;
      auVar58._12_4_ = auStack_21ff0._8_4_;
      auVar93 = minps(auVar58,auStack_21ff0);
      auVar12._4_8_ = auStack_21ff0._8_8_;
      auVar12._0_4_ = auVar93._4_4_;
      auVar66._0_8_ = auVar12._0_8_ << 0x20;
      auVar66._8_4_ = auVar93._8_4_;
      auVar66._12_4_ = auVar93._12_4_;
      auVar67._8_8_ = auVar93._8_8_;
      auVar67._0_8_ = auVar66._8_8_;
      if (auVar93._0_4_ <= auVar93._8_4_) {
        auVar67._0_4_ = auVar93._0_4_;
      }
      (__return_storage_ptr__->lower).field_0.m128[0] = auVar67._0_4_;
      auVar59._4_4_ = auStack_22040._0_4_;
      auVar59._0_4_ = auStack_22040._4_4_;
      auVar59._8_4_ = auStack_22040._12_4_;
      auVar59._12_4_ = auStack_22040._8_4_;
      auVar93 = minps(auVar59,auStack_22040);
      auVar13._4_8_ = auStack_22040._8_8_;
      auVar13._0_4_ = auVar93._4_4_;
      auVar68._0_8_ = auVar13._0_8_ << 0x20;
      auVar68._8_4_ = auVar93._8_4_;
      auVar68._12_4_ = auVar93._12_4_;
      auVar69._8_8_ = auVar93._8_8_;
      auVar69._0_8_ = auVar68._8_8_;
      if (auVar93._0_4_ <= auVar93._8_4_) {
        auVar69._0_4_ = auVar93._0_4_;
      }
      (__return_storage_ptr__->lower).field_0.m128[1] = auVar69._0_4_;
      auVar60._4_4_ = auVar84._0_4_;
      auVar60._0_4_ = auVar84._4_4_;
      auVar60._8_4_ = auVar84._12_4_;
      auVar60._12_4_ = auVar84._8_4_;
      auVar84 = minps(auVar60,auVar84);
      auVar14._4_8_ = auVar69._8_8_;
      auVar14._0_4_ = auVar84._4_4_;
      auVar70._0_8_ = auVar14._0_8_ << 0x20;
      auVar70._8_4_ = auVar84._8_4_;
      auVar70._12_4_ = auVar84._12_4_;
      auVar71._8_8_ = auVar84._8_8_;
      auVar71._0_8_ = auVar70._8_8_;
      if (auVar84._0_4_ <= auVar84._8_4_) {
        auVar71._0_4_ = auVar84._0_4_;
      }
      (__return_storage_ptr__->lower).field_0.m128[2] = auVar71._0_4_;
      auVar61._4_4_ = auVar80._0_4_;
      auVar61._0_4_ = auVar80._4_4_;
      auVar61._8_4_ = auVar80._12_4_;
      auVar61._12_4_ = auVar80._8_4_;
      auVar80 = maxps(auVar61,auVar80);
      auVar15._4_8_ = auVar71._8_8_;
      auVar15._0_4_ = auVar80._4_4_;
      auVar72._0_8_ = auVar15._0_8_ << 0x20;
      auVar72._8_4_ = auVar80._8_4_;
      auVar72._12_4_ = auVar80._12_4_;
      auVar73._8_8_ = auVar80._8_8_;
      auVar73._0_8_ = auVar72._8_8_;
      if (auVar80._8_4_ <= auVar80._0_4_) {
        auVar73._0_4_ = auVar80._0_4_;
      }
      (__return_storage_ptr__->upper).field_0.m128[0] = auVar73._0_4_;
      auVar62._4_4_ = auVar63._0_4_;
      auVar62._0_4_ = auVar63._4_4_;
      auVar62._8_4_ = auVar63._12_4_;
      auVar62._12_4_ = auVar63._8_4_;
      auVar63 = maxps(auVar62,auVar63);
      auVar16._4_8_ = auVar73._8_8_;
      auVar16._0_4_ = auVar63._4_4_;
      auVar74._0_8_ = auVar16._0_8_ << 0x20;
      auVar74._8_4_ = auVar63._8_4_;
      auVar74._12_4_ = auVar63._12_4_;
      auVar75._8_8_ = auVar63._8_8_;
      auVar75._0_8_ = auVar74._8_8_;
      if (auVar63._8_4_ <= auVar63._0_4_) {
        auVar75._0_4_ = auVar63._0_4_;
      }
      (__return_storage_ptr__->upper).field_0.m128[1] = auVar75._0_4_;
      auVar63._4_4_ = auVar88._0_4_;
      auVar63._0_4_ = auVar88._4_4_;
      auVar63._8_4_ = auVar88._12_4_;
      auVar63._12_4_ = auVar88._8_4_;
      auVar63 = maxps(auVar63,auVar88);
      auVar17._4_8_ = auVar75._8_8_;
      auVar17._0_4_ = auVar63._4_4_;
      auVar88._0_8_ = auVar17._0_8_ << 0x20;
      auVar88._8_4_ = auVar63._8_4_;
      auVar88._12_4_ = auVar63._12_4_;
      auVar76._8_8_ = auVar63._8_8_;
      auVar76._0_8_ = auVar88._8_8_;
      if (auVar63._8_4_ <= auVar63._0_4_) {
        auVar76._0_4_ = auVar63._0_4_;
      }
      (__return_storage_ptr__->upper).field_0.m128[2] = auVar76._0_4_;
      goto LAB_00d5c0ee;
    }
    Nx = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 **)&(geom->super_Geometry).field_0x58;
    pfStack_1c280 = (float *)&uStack_20280;
    pfStack_18240 = (float *)auStack_1c240;
    pfStack_14200 = (float *)auStack_18200;
    uStack_1c278 = uVar49;
    uStack_18238 = uVar49;
    uStack_141f8 = uVar49;
  }
  else {
    sVar5 = uVar49 * 4;
    pfStack_101c0 = (float *)alignedMalloc(sVar5,0x40);
    local_c180 = (float *)alignedMalloc(sVar5,0x40);
    auVar63 = _DAT_01f7aa00;
    if (patch->type != '\x05') goto LAB_00d5be81;
    Nx = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 **)&(geom->super_Geometry).field_0x58;
    uStack_1c278 = uVar49;
    pfStack_1c280 = (float *)alignedMalloc(sVar5,0x40);
    uStack_18238 = uVar49;
    pfStack_18240 = (float *)alignedMalloc(sVar5,0x40);
    uStack_141f8 = uVar49;
    pfStack_14200 = (float *)alignedMalloc(sVar5,0x40);
  }
  puStack_21f50 = &(geom->super_Geometry).field_0x58;
  if (Nx == (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)0x0) {
    uVar49 = 0;
  }
  local_8138 = uVar49;
  local_40f8 = uVar49;
  local_b8 = uVar49;
  if (uVar49 < 0x1001) {
    local_4100 = local_8100;
    local_8140 = local_c140;
    local_c0 = local_40c0;
  }
  else {
    sVar5 = uVar49 * 4;
    local_4100 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)alignedMalloc(sVar5,0x40);
    local_8140 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)alignedMalloc(sVar5,0x40);
    local_c0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)alignedMalloc(sVar5,0x40);
  }
  pRVar8 = (geom->patch_eval_trees).
           super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((geom->patch_eval_trees).
      super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
      ._M_impl.super__Vector_impl_data._M_finish == pRVar8) {
    pfVar42 = *(float **)&patch->patch_v[0][0].field_0;
    uVar37 = patch->time_;
    pBVar9 = (geom->vertices).items;
    lVar46 = 0x1c00;
    puVar45 = auStack_21b9c;
    do {
      *(undefined4 **)(puVar45 + -0x49) = puVar45 + -0xc9;
      *(undefined4 **)(puVar45 + -0x19) = puVar45 + -0x39;
      *(undefined8 *)(puVar45 + -2) = 0;
      *puVar45 = 0;
      puVar45 = puVar45 + 0xe0;
      lVar46 = lVar46 + -0x380;
    } while (lVar46 != 0);
    paStack_20300 = &aStack_21f00;
    pcVar10 = pBVar9[uVar37].super_RawBufferView.ptr_ofs;
    uVar30 = (ulong)(uint)pBVar9[uVar37].super_RawBufferView.stride;
    lVar46 = 0x40;
    lVar47 = 0x280;
    pfVar48 = pfVar42;
    uVar49 = 0;
    do {
      if ((7 < uVar49) && (paStack_20300 == &aStack_21f00)) {
        alignedMalloc(0x3840,0x40);
        evalGridBounds();
        lVar34 = 0;
        do {
          GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=
                    ((GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)
                     ((long)paStack_20300 + lVar34),
                     (GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)
                     ((long)&aStack_21f00 + lVar34));
          lVar34 = lVar34 + 0x380;
        } while (lVar34 != 0x1c00);
      }
      paVar26 = paStack_20300;
      uVar6 = uVar49 + 1;
      paVar2 = paStack_20300 + uVar49 * 0x38;
      paVar3 = paStack_20300 + uVar49 * 0x38;
      pfVar50 = paVar3->m128 + 0x10;
      *(undefined1 *)(paVar3->m128 + 0xd6) = 1;
      paVar3->m128[0xd2] = -NAN;
      uVar24 = *(undefined8 *)(pcVar10 + (uint)*pfVar48 * uVar30);
      uVar25 = *(undefined8 *)(pcVar10 + (uint)*pfVar48 * uVar30 + 8);
      *(float *)paVar3 = (float)(int)uVar24;
      *(int *)((long)paVar3 + 4) = (int)((ulong)uVar24 >> 0x20);
      *(undefined8 *)&(paVar3->field_1).z = uVar25;
      paVar3->m128[0xd3] = pfVar48[5];
      paVar3->m128[0xd5] = pfVar48[6];
      paVar3->m128[0xd4] = 0.0;
      pfVar7 = paStack_20300->m128 + uVar49 * 0xe0 + 0xa0;
      fVar89 = -NAN;
      fVar94 = -NAN;
      fStack_22024 = -NAN;
      fVar55 = 0.0;
      uVar51 = 0;
      pfVar33 = pfVar48;
      do {
        fVar43 = pfVar33[2];
        fVar40 = pfVar33[1];
        fVar95 = pfVar33[6];
        if (pfVar33[6] <= paVar2->m128[0xd4]) {
          fVar95 = paVar2->m128[0xd4];
        }
        fVar104 = pfVar33[4];
        paVar2->m128[0xd4] = fVar95;
        bVar57 = (uint)pfVar33[(long)(int)fVar40 * 8] < (uint)fStack_22024;
        if (bVar57) {
          fVar89 = fVar55;
        }
        fVar95 = (float)uVar51;
        if (bVar57) {
          fVar94 = fVar95;
        }
        pfVar32 = pfVar33 + (long)(int)fVar40 * 8;
        if (bVar57) {
          fStack_22024 = pfVar33[(long)(int)fVar40 * 8];
        }
        if (fVar40 == fVar43) {
          fVar43 = 0.0;
          pfVar33 = pfVar32;
        }
        else {
          pfVar33 = pfVar33 + (long)(int)fVar43 * 8;
          fVar43 = 0.0;
          do {
            uVar41 = (ulong)(uint)fVar55;
            auVar63 = *(undefined1 (*) [16])(pcVar10 + (uint)*pfVar32 * uVar30);
            fVar55 = (float)((int)fVar55 + 1);
            pfVar31 = *(float **)(paVar2->m128 + 0x90);
            if ((0x20 < (uint)fVar55) && (pfVar31 == pfVar50)) {
              pvVar35 = alignedMalloc(0x800,0x10);
              *(void **)(paVar2->m128 + 0x90) = pvVar35;
              lVar34 = 0;
              do {
                lVar11 = *(long *)(paVar2->m128 + 0x90);
                puVar4 = (undefined8 *)((long)paVar26 + lVar34 + lVar46);
                uVar24 = puVar4[1];
                *(undefined8 *)(lVar11 + lVar34) = *puVar4;
                ((undefined8 *)(lVar11 + lVar34))[1] = uVar24;
                lVar34 = lVar34 + 0x10;
              } while (lVar34 != 0x200);
              pfVar31 = *(float **)(paVar2->m128 + 0x90);
            }
            auStack_21ff0._0_8_ = auVar63._0_8_;
            auStack_21ff0._8_8_ = auVar63._8_8_;
            *(undefined8 *)(pfVar31 + uVar41 * 4) = auStack_21ff0._0_8_;
            *(undefined8 *)(pfVar31 + uVar41 * 4 + 2) = auStack_21ff0._8_8_;
            fVar43 = (float)((int)fVar43 + 1);
            pfVar32 = pfVar32 + (long)(int)pfVar32[1] * 8;
          } while (pfVar32 != pfVar33);
        }
        fVar40 = (float)((int)fVar95 + 1);
        uVar41 = (ulong)(uint)fVar40;
        pfVar32 = *(float **)(paVar2->m128 + 0xc0);
        if ((0x10 < (uint)fVar40) && (pfVar32 == pfVar7)) {
          pvVar35 = operator_new__(0x200);
          *(void **)(paVar2->m128 + 0xc0) = pvVar35;
          lVar34 = 0;
          do {
            *(undefined8 *)(*(long *)(paVar2->m128 + 0xc0) + lVar34 * 8) =
                 *(undefined8 *)((long)paVar26 + lVar34 * 8 + lVar47);
            lVar34 = lVar34 + 1;
          } while (lVar34 != 0x10);
          pfVar32 = *(float **)(paVar2->m128 + 0xc0);
        }
        pfVar32[uVar51 * 2] = fVar43;
        pfVar32[uVar51 * 2 + 1] = fVar104;
        *(byte *)(paVar2->m128 + 0xd6) = *(byte *)(paVar2->m128 + 0xd6) & fVar43 == 2.8026e-45;
        if ((long)(int)pfVar33[3] == 0) {
          if ((uint)*pfVar33 < (uint)fStack_22024) {
            fStack_22024 = *pfVar33;
            fVar89 = fVar55;
            fVar94 = fVar40;
          }
          paVar2->m128[0xd2] = fVar40;
          uVar37 = (int)fVar95 + 2;
          pfVar32 = *(float **)(paVar2->m128 + 0xc0);
          if ((0x10 < uVar37) && (pfVar32 == pfVar7)) {
            pvVar35 = operator_new__(0x200);
            *(void **)(paVar2->m128 + 0xc0) = pvVar35;
            lVar34 = 0;
            do {
              *(undefined8 *)(*(long *)(paVar2->m128 + 0xc0) + lVar34 * 8) =
                   *(undefined8 *)((long)paVar26 + lVar34 * 8 + lVar47);
              lVar34 = lVar34 + 1;
            } while (lVar34 != 0x10);
            pfVar32 = *(float **)(paVar2->m128 + 0xc0);
          }
          (pfVar32 + uVar41 * 2)[0] = 2.8026e-45;
          (pfVar32 + uVar41 * 2)[1] = INFINITY;
          auVar63 = *(undefined1 (*) [16])(pcVar10 + (uint)*pfVar33 * uVar30);
          uVar44 = (int)fVar55 + 1;
          pfVar33 = *(float **)(paVar2->m128 + 0x90);
          if ((0x20 < uVar44) && (pfVar33 == pfVar50)) {
            pvVar35 = alignedMalloc(0x800,0x10);
            *(void **)(paVar2->m128 + 0x90) = pvVar35;
            lVar34 = 0;
            do {
              lVar11 = *(long *)(paVar2->m128 + 0x90);
              puVar4 = (undefined8 *)((long)paVar26 + lVar34 + lVar46);
              uVar24 = puVar4[1];
              *(undefined8 *)(lVar11 + lVar34) = *puVar4;
              ((undefined8 *)(lVar11 + lVar34))[1] = uVar24;
              lVar34 = lVar34 + 0x10;
            } while (lVar34 != 0x200);
            pfVar33 = *(float **)(paVar2->m128 + 0x90);
          }
          auStack_21ff0._0_8_ = auVar63._0_8_;
          auStack_21ff0._8_8_ = auVar63._8_8_;
          *(undefined8 *)(pfVar33 + (ulong)(uint)fVar55 * 4) = auStack_21ff0._0_8_;
          *(undefined8 *)(pfVar33 + (ulong)(uint)fVar55 * 4 + 2) = auStack_21ff0._8_8_;
          fVar55 = (float)((int)fVar55 + 2);
          pfVar33 = *(float **)(paVar2->m128 + 0x90);
          if ((0x20 < (uint)fVar55) && (pfVar33 == pfVar50)) {
            pvVar35 = alignedMalloc(0x800,0x10);
            *(void **)(paVar2->m128 + 0x90) = pvVar35;
            lVar34 = 0;
            do {
              lVar11 = *(long *)(paVar2->m128 + 0x90);
              puVar4 = (undefined8 *)((long)paVar26 + lVar34 + lVar46);
              uVar24 = puVar4[1];
              *(undefined8 *)(lVar11 + lVar34) = *puVar4;
              ((undefined8 *)(lVar11 + lVar34))[1] = uVar24;
              lVar34 = lVar34 + 0x10;
            } while (lVar34 != 0x200);
            pfVar33 = *(float **)(paVar2->m128 + 0x90);
          }
          fVar95 = *(float *)((long)paVar2 + 4);
          uVar24 = *(undefined8 *)&(paVar2->field_1).z;
          pfVar33 = pfVar33 + (ulong)uVar44 * 4;
          pfVar33[0] = *(float *)paVar2;
          pfVar33[1] = fVar95;
          *(undefined8 *)(pfVar33 + 2) = uVar24;
          fVar95 = pfVar48[3];
          pfVar32 = pfVar48;
          if (fVar95 == 0.0) break;
          do {
            lVar34 = (long)(int)fVar95;
            pfVar33 = pfVar32 + lVar34 * 8 + (long)(int)pfVar32[lVar34 * 8 + 1] * 8;
            fVar95 = pfVar32[lVar34 * 8 + (long)(int)pfVar32[lVar34 * 8 + 1] * 8 + 3];
            pfVar32 = pfVar33;
          } while (fVar95 != 0.0);
          uVar41 = (ulong)uVar37;
        }
        else {
          pfVar33 = pfVar33 + (long)(int)pfVar33[3] * 8;
        }
        uVar37 = (uint)uVar41;
        uVar51 = uVar41;
      } while (pfVar33 != pfVar48);
      paVar2->m128[0xd1] = fVar55;
      *(uint *)(paVar2 + 0x34) = uVar37;
      paVar2->m128[0xd9] = fStack_22024;
      paVar2->m128[0xd7] = fVar94;
      paVar2->m128[0xd8] = fVar89;
      if (0xe < uVar49) break;
      pfVar48 = pfVar48 + (long)(int)pfVar48[1] * 8;
      lVar46 = lVar46 + 0x380;
      lVar47 = lVar47 + 0x380;
      uVar49 = uVar6;
    } while (pfVar48 != pfVar42);
    uStack_202c0 = (undefined4)uVar6;
    pfVar42 = (float *)0x0;
    if ((patch->flags & 0x10) != 0) {
      pfVar42 = patch->level;
    }
    paVar54 = Nx;
    paVar56 = Nx;
    if (Nx != (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)0x0) {
      Nx = local_4100;
      paVar54 = local_c0;
      paVar56 = local_8140;
    }
    feature_adaptive_eval_grid<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
              ((GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *)&aStack_21f00.field_1,
               (uint)patch->patch_v[0][0].field_0.m128[2],pfVar42,x0,x1,y0,y1,swidth,sheight,
               pfStack_1c280,pfStack_18240,pfStack_14200,pfStack_101c0,local_c180,Nx->v,paVar56->v,
               paVar54->v,dwidth,uVar52);
    GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::~GeneralCatmullClarkPatchT
              ((GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *)&aStack_21f00.field_1);
  }
  else {
    pfVar42 = (float *)0x0;
    if ((patch->flags & 0x10) != 0) {
      pfVar42 = patch->level;
    }
    paVar54 = Nx;
    paVar56 = Nx;
    if (Nx != (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)0x0) {
      Nx = local_c0;
      paVar54 = local_4100;
      paVar56 = local_8140;
    }
    feature_adaptive_eval_grid<embree::sse2::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
              (pRVar8 + (ulong)(patch->prim * (geom->super_Geometry).numTimeSteps + patch->time_) *
                        8,(uint)patch->patch_v[0][0].field_0.m128[2],pfVar42,x0,x1,y0,y1,swidth,
               sheight,pfStack_1c280,pfStack_18240,pfStack_14200,pfStack_101c0,local_c180,paVar54->v
               ,paVar56->v,Nx->v,dwidth,uVar52);
  }
  if (*(code **)puStack_21f50 != (code *)0x0) {
    aStack_21f00._0_8_ = (geom->super_Geometry).userPtr;
    aStack_21f00._8_8_ = geom;
    uStack_21ef0 = patch->prim;
    uStack_21eec = patch->time_;
    pfStack_21ee8 = pfStack_101c0;
    pfStack_21ee0 = local_c180;
    paStack_21ed8 = local_4100;
    paStack_21ed0 = local_8140;
    paStack_21ec8 = local_c0;
    pfStack_21ec0 = pfStack_1c280;
    pfStack_21eb8 = pfStack_18240;
    pfStack_21eb0 = pfStack_14200;
    uStack_21ea8 = uVar39;
    (**(code **)puStack_21f50)();
  }
  if (uVar39 < (uVar27 & 0xfffffffc)) {
    uVar39 = uVar39 - 1;
    fVar89 = pfStack_101c0[uVar39];
    fVar94 = local_c180[uVar39];
    fVar55 = pfStack_1c280[uVar39];
    fVar95 = pfStack_18240[uVar39];
    fVar43 = pfStack_14200[uVar39];
    do {
      pfStack_101c0[uVar36] = fVar89;
      local_c180[uVar36] = fVar94;
      pfStack_1c280[uVar36] = fVar55;
      pfStack_18240[uVar36] = fVar95;
      pfStack_14200[uVar36] = fVar43;
      uVar36 = uVar36 + 1;
    } while ((uVar27 & 0xfffffffc) != uVar36);
  }
  auVar63 = _DAT_01f7aa00;
  auVar80 = _DAT_01f7aa00;
  auVar84 = _DAT_01f7aa00;
  auVar88 = _DAT_01f7a9f0;
  auVar93 = _DAT_01f7a9f0;
  auVar100 = _DAT_01f7a9f0;
  if (3 < uVar27) {
    lVar46 = 0;
    do {
      auVar100 = minps(auVar100,*(undefined1 (*) [16])((long)pfStack_1c280 + lVar46));
      auVar93 = minps(auVar93,*(undefined1 (*) [16])((long)pfStack_18240 + lVar46));
      auVar88 = minps(auVar88,*(undefined1 (*) [16])((long)pfStack_14200 + lVar46));
      auVar84 = maxps(auVar84,*(undefined1 (*) [16])((long)pfStack_1c280 + lVar46));
      auVar80 = maxps(auVar80,*(undefined1 (*) [16])((long)pfStack_18240 + lVar46));
      auVar63 = maxps(auVar63,*(undefined1 (*) [16])((long)pfStack_14200 + lVar46));
      lVar46 = lVar46 + 0x10;
    } while ((ulong)(uVar28 + (uVar28 == 0)) << 4 != lVar46);
  }
  auVar102._4_4_ = auVar100._0_4_;
  auVar102._0_4_ = auVar100._4_4_;
  auVar102._8_4_ = auVar100._12_4_;
  auVar102._12_4_ = auVar100._8_4_;
  auVar103 = minps(auVar102,auVar100);
  auVar18._4_8_ = auVar100._8_8_;
  auVar18._0_4_ = auVar103._4_4_;
  auVar97._0_8_ = auVar18._0_8_ << 0x20;
  auVar97._8_4_ = auVar103._8_4_;
  auVar97._12_4_ = auVar103._12_4_;
  auVar98._8_8_ = auVar103._8_8_;
  auVar98._0_8_ = auVar97._8_8_;
  if (auVar103._0_4_ <= auVar103._8_4_) {
    auVar98._0_4_ = auVar103._0_4_;
  }
  (__return_storage_ptr__->lower).field_0.m128[0] = auVar98._0_4_;
  auVar99._4_4_ = auVar93._0_4_;
  auVar99._0_4_ = auVar93._4_4_;
  auVar99._8_4_ = auVar93._12_4_;
  auVar99._12_4_ = auVar93._8_4_;
  auVar100 = minps(auVar99,auVar93);
  auVar19._4_8_ = auVar93._8_8_;
  auVar19._0_4_ = auVar100._4_4_;
  auVar90._0_8_ = auVar19._0_8_ << 0x20;
  auVar90._8_4_ = auVar100._8_4_;
  auVar90._12_4_ = auVar100._12_4_;
  auVar91._8_8_ = auVar100._8_8_;
  auVar91._0_8_ = auVar90._8_8_;
  if (auVar100._0_4_ <= auVar100._8_4_) {
    auVar91._0_4_ = auVar100._0_4_;
  }
  (__return_storage_ptr__->lower).field_0.m128[1] = auVar91._0_4_;
  auVar92._4_4_ = auVar88._0_4_;
  auVar92._0_4_ = auVar88._4_4_;
  auVar92._8_4_ = auVar88._12_4_;
  auVar92._12_4_ = auVar88._8_4_;
  auVar93 = minps(auVar92,auVar88);
  auVar20._4_8_ = auVar88._8_8_;
  auVar20._0_4_ = auVar93._4_4_;
  auVar85._0_8_ = auVar20._0_8_ << 0x20;
  auVar85._8_4_ = auVar93._8_4_;
  auVar85._12_4_ = auVar93._12_4_;
  auVar86._8_8_ = auVar93._8_8_;
  auVar86._0_8_ = auVar85._8_8_;
  if (auVar93._0_4_ <= auVar93._8_4_) {
    auVar86._0_4_ = auVar93._0_4_;
  }
  (__return_storage_ptr__->lower).field_0.m128[2] = auVar86._0_4_;
  auVar87._4_4_ = auVar84._0_4_;
  auVar87._0_4_ = auVar84._4_4_;
  auVar87._8_4_ = auVar84._12_4_;
  auVar87._12_4_ = auVar84._8_4_;
  auVar88 = maxps(auVar87,auVar84);
  auVar21._4_8_ = auVar84._8_8_;
  auVar21._0_4_ = auVar88._4_4_;
  auVar81._0_8_ = auVar21._0_8_ << 0x20;
  auVar81._8_4_ = auVar88._8_4_;
  auVar81._12_4_ = auVar88._12_4_;
  auVar82._8_8_ = auVar88._8_8_;
  auVar82._0_8_ = auVar81._8_8_;
  if (auVar88._8_4_ <= auVar88._0_4_) {
    auVar82._0_4_ = auVar88._0_4_;
  }
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar82._0_4_;
  auVar83._4_4_ = auVar80._0_4_;
  auVar83._0_4_ = auVar80._4_4_;
  auVar83._8_4_ = auVar80._12_4_;
  auVar83._12_4_ = auVar80._8_4_;
  auVar84 = maxps(auVar83,auVar80);
  auVar22._4_8_ = auVar80._8_8_;
  auVar22._0_4_ = auVar84._4_4_;
  auVar77._0_8_ = auVar22._0_8_ << 0x20;
  auVar77._8_4_ = auVar84._8_4_;
  auVar77._12_4_ = auVar84._12_4_;
  auVar78._8_8_ = auVar84._8_8_;
  auVar78._0_8_ = auVar77._8_8_;
  if (auVar84._8_4_ <= auVar84._0_4_) {
    auVar78._0_4_ = auVar84._0_4_;
  }
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar78._0_4_;
  auVar79._4_4_ = auVar63._0_4_;
  auVar79._0_4_ = auVar63._4_4_;
  auVar79._8_4_ = auVar63._12_4_;
  auVar79._12_4_ = auVar63._8_4_;
  auVar80 = maxps(auVar79,auVar63);
  auVar23._4_8_ = auVar63._8_8_;
  auVar23._0_4_ = auVar80._4_4_;
  auVar64._0_8_ = auVar23._0_8_ << 0x20;
  auVar64._8_4_ = auVar80._8_4_;
  auVar64._12_4_ = auVar80._12_4_;
  auVar65._8_8_ = auVar80._8_8_;
  auVar65._0_8_ = auVar64._8_8_;
  if (auVar80._8_4_ <= auVar80._0_4_) {
    auVar65._0_4_ = auVar80._0_4_;
  }
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar65._0_4_;
  if (local_c0 != local_40c0) {
    alignedFree(local_c0);
  }
  if (local_8140 != local_c140) {
    alignedFree(local_8140);
  }
  if (local_4100 != local_8100) {
    alignedFree(local_4100);
  }
  if (pfStack_14200 != (float *)auStack_18200) {
    alignedFree(pfStack_14200);
  }
  if (pfStack_18240 != (float *)auStack_1c240) {
    alignedFree(pfStack_18240);
  }
  if (pfStack_1c280 != (float *)&uStack_20280) {
    alignedFree(pfStack_1c280);
  }
LAB_00d5c0ee:
  if (local_c180 != afStack_10180) {
    alignedFree(local_c180);
  }
  if (pfStack_101c0 != afStack_141c0) {
    alignedFree(pfStack_101c0);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox3fa evalGridBounds(const SubdivPatch1Base& patch,
                           const unsigned x0, const unsigned x1,
                           const unsigned y0, const unsigned y1,
                           const unsigned swidth, const unsigned sheight,
                           const SubdivMesh* const geom)
    {
      BBox3fa b(empty);
      const unsigned dwidth  = x1-x0+1;
      const unsigned dheight = y1-y0+1;
      const unsigned M = dwidth*dheight+VSIZEX;
      const unsigned grid_size_simd_blocks = (M-1)/VSIZEX;
      dynamic_large_stack_array(float,grid_u,M,64*64*sizeof(float));
      dynamic_large_stack_array(float,grid_v,M,64*64*sizeof(float));

      if (unlikely(patch.type == SubdivPatch1Base::EVAL_PATCH))
      {
        const bool displ = geom->displFunc;
        dynamic_large_stack_array(float,grid_x,M,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_y,M,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_z,M,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_x,displ ? M : 0,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_y,displ ? M : 0,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_z,displ ? M : 0,64*64*sizeof(float));

        if (geom->patch_eval_trees.size())
        {
          feature_adaptive_eval_grid<PatchEvalGrid> 
            (geom->patch_eval_trees[geom->numTimeSteps*patch.primID()+patch.time()], patch.subPatch(), patch.needsStitching() ? patch.level : nullptr,
             x0,x1,y0,y1,swidth,sheight,
             grid_x,grid_y,grid_z,grid_u,grid_v,
             displ ? (float*)grid_Ng_x : nullptr, displ ? (float*)grid_Ng_y : nullptr, displ ? (float*)grid_Ng_z : nullptr,
             dwidth,dheight);
        } 
        else 
        {
          GeneralCatmullClarkPatch3fa ccpatch(patch.edge(),geom->getVertexBuffer(patch.time()));
          
          feature_adaptive_eval_grid <FeatureAdaptiveEvalGrid,GeneralCatmullClarkPatch3fa>
            (ccpatch, patch.subPatch(), patch.needsStitching() ? patch.level : nullptr,
            x0,x1,y0,y1,swidth,sheight,
            grid_x,grid_y,grid_z,grid_u,grid_v,
            displ ? (float*)grid_Ng_x : nullptr, displ ? (float*)grid_Ng_y : nullptr, displ ? (float*)grid_Ng_z : nullptr,
            dwidth,dheight);
        }

        /* call displacement shader */
        if (unlikely(geom->displFunc))
        {
          RTCDisplacementFunctionNArguments args;
          args.geometryUserPtr = geom->userPtr;
          args.geometry = (RTCGeometry)geom;
          //args.geomID = patch.geomID();
          args.primID = patch.primID();
          args.timeStep = patch.time();
          args.u = grid_u;
          args.v = grid_v;
          args.Ng_x = grid_Ng_x;
          args.Ng_y = grid_Ng_y;
          args.Ng_z = grid_Ng_z;
          args.P_x = grid_x;
          args.P_y = grid_y;
          args.P_z = grid_z;
          args.N = dwidth*dheight;
          geom->displFunc(&args);
        }

        /* set last elements in u,v array to 1.0f */
        const float last_u = grid_u[dwidth*dheight-1];
        const float last_v = grid_v[dwidth*dheight-1];
        const float last_x = grid_x[dwidth*dheight-1];
        const float last_y = grid_y[dwidth*dheight-1];
        const float last_z = grid_z[dwidth*dheight-1];
        for (unsigned i=dwidth*dheight;i<grid_size_simd_blocks*VSIZEX;i++)
        {
          grid_u[i] = last_u;
          grid_v[i] = last_v;
          grid_x[i] = last_x;
          grid_y[i] = last_y;
          grid_z[i] = last_z;
        }

        vfloatx bounds_min_x = pos_inf;
        vfloatx bounds_min_y = pos_inf;
        vfloatx bounds_min_z = pos_inf;
        vfloatx bounds_max_x = neg_inf;
        vfloatx bounds_max_y = neg_inf;
        vfloatx bounds_max_z = neg_inf;
        for (unsigned i = 0; i<grid_size_simd_blocks; i++)
        {
          vfloatx x = vfloatx::loadu(&grid_x[i * VSIZEX]);
          vfloatx y = vfloatx::loadu(&grid_y[i * VSIZEX]);
          vfloatx z = vfloatx::loadu(&grid_z[i * VSIZEX]);

	  bounds_min_x = min(bounds_min_x,x);
	  bounds_min_y = min(bounds_min_y,y);
	  bounds_min_z = min(bounds_min_z,z);

	  bounds_max_x = max(bounds_max_x,x);
	  bounds_max_y = max(bounds_max_y,y);
	  bounds_max_z = max(bounds_max_z,z);
        }

        b.lower.x = reduce_min(bounds_min_x);  
        b.lower.y = reduce_min(bounds_min_y);
        b.lower.z = reduce_min(bounds_min_z);
        b.upper.x = reduce_max(bounds_max_x);
        b.upper.y = reduce_max(bounds_max_y);
        b.upper.z = reduce_max(bounds_max_z);
        //b.lower.a = 0;
        //b.upper.a = 0;
      }
      else
      {
        /* grid_u, grid_v need to be padded as we write with SIMD granularity */
        gridUVTessellator(patch.level,swidth,sheight,x0,y0,dwidth,dheight,grid_u,grid_v);
      
        /* set last elements in u,v array to last valid point */
        const float last_u = grid_u[dwidth*dheight-1];
        const float last_v = grid_v[dwidth*dheight-1];
        for (unsigned i=dwidth*dheight;i<grid_size_simd_blocks*VSIZEX;i++) {
          grid_u[i] = last_u;
          grid_v[i] = last_v;
        }

        /* stitch edges if necessary */
        if (unlikely(patch.needsStitching()))
          stitchUVGrid(patch.level,swidth,sheight,x0,y0,dwidth,dheight,grid_u,grid_v);
      
        /* iterates over all grid points */
        Vec3vfx bounds_min;
        bounds_min[0] = pos_inf;
        bounds_min[1] = pos_inf;
        bounds_min[2] = pos_inf;

        Vec3vfx bounds_max;
        bounds_max[0] = neg_inf;
        bounds_max[1] = neg_inf;
        bounds_max[2] = neg_inf;

        for (unsigned i=0; i<grid_size_simd_blocks; i++)
        {
          const vfloatx u = vfloatx::load(&grid_u[i*VSIZEX]);
          const vfloatx v = vfloatx::load(&grid_v[i*VSIZEX]);
          Vec3vfx vtx = patchEval(patch,u,v);
        
          /* evaluate displacement function */
          if (unlikely(geom->displFunc != nullptr))
          {
            const Vec3vfx normal = normalize_safe(patchNormal(patch,u,v));
            RTCDisplacementFunctionNArguments args;
            args.geometryUserPtr = geom->userPtr;
            args.geometry = (RTCGeometry)geom;
            //args.geomID = patch.geomID();
            args.primID = patch.primID();
            args.timeStep = patch.time();
            args.u = &u[0];
            args.v = &v[0];
            args.Ng_x = &normal.x[0];
            args.Ng_y = &normal.y[0];
            args.Ng_z = &normal.z[0];
            args.P_x = &vtx.x[0];
            args.P_y = &vtx.y[0];
            args.P_z = &vtx.z[0];
            args.N = VSIZEX;
            geom->displFunc(&args);
          }

          bounds_min[0] = min(bounds_min[0],vtx.x);
          bounds_max[0] = max(bounds_max[0],vtx.x);
          bounds_min[1] = min(bounds_min[1],vtx.y);
          bounds_max[1] = max(bounds_max[1],vtx.y);
          bounds_min[2] = min(bounds_min[2],vtx.z);
          bounds_max[2] = max(bounds_max[2],vtx.z);      
        }

        b.lower.x = reduce_min(bounds_min[0]);
        b.lower.y = reduce_min(bounds_min[1]);
        b.lower.z = reduce_min(bounds_min[2]);
        b.upper.x = reduce_max(bounds_max[0]);
        b.upper.y = reduce_max(bounds_max[1]);
        b.upper.z = reduce_max(bounds_max[2]);
        //b.lower.a = 0;
        //b.upper.a = 0;
      }

      assert( std::isfinite(b.lower.x) );
      assert( std::isfinite(b.lower.y) );
      assert( std::isfinite(b.lower.z) );

      assert( std::isfinite(b.upper.x) );
      assert( std::isfinite(b.upper.y) );
      assert( std::isfinite(b.upper.z) );


      assert(b.lower.x <= b.upper.x);
      assert(b.lower.y <= b.upper.y);
      assert(b.lower.z <= b.upper.z);
      return b;
    }